

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void mi_buffered_out(char *msg,void *arg)

{
  char cVar1;
  ulong uVar2;
  char c;
  buffered_t *buf;
  char *src;
  
  if (arg != (void *)0x0 && msg != (char *)0x0) {
    for (; cVar1 = *msg, cVar1 != '\0'; msg = msg + 1) {
      uVar2 = *(ulong *)((long)arg + 0x18);
      if (*(ulong *)((long)arg + 0x20) <= uVar2) {
        mi_buffered_flush((buffered_t *)arg);
        uVar2 = *(ulong *)((long)arg + 0x18);
      }
      *(ulong *)((long)arg + 0x18) = uVar2 + 1;
      *(char *)(*(long *)((long)arg + 0x10) + uVar2) = cVar1;
      if (cVar1 == '\n') {
        mi_buffered_flush((buffered_t *)arg);
      }
    }
  }
  return;
}

Assistant:

static void mi_cdecl mi_buffered_out(const char* msg, void* arg) {
  buffered_t* buf = (buffered_t*)arg;
  if (msg==NULL || buf==NULL) return;
  for (const char* src = msg; *src != 0; src++) {
    char c = *src;
    if (buf->used >= buf->count) mi_buffered_flush(buf);
    mi_assert_internal(buf->used < buf->count);
    buf->buf[buf->used++] = c;
    if (c == '\n') mi_buffered_flush(buf);
  }
}